

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlparse.c
# Opt level: O1

XML_Error cdataSectionProcessor(XML_Parser parser,char *start,char *end,char **endPtr)

{
  XML_Error XVar1;
  XML_Account in_stack_ffffffffffffffd8;
  char *local_20;
  
  local_20 = start;
  XVar1 = doCdataSection(parser,parser->m_encoding,&local_20,end,endPtr,
                         (parser->m_parsingStatus).finalBuffer == '\0',in_stack_ffffffffffffffd8);
  if (XVar1 == XML_ERROR_NONE) {
    if (local_20 != (char *)0x0) {
      if (parser->m_parentParser != (XML_Parser)0x0) {
        parser->m_processor = externalEntityContentProcessor;
        XVar1 = externalEntityContentProcessor(parser,local_20,end,endPtr);
        return XVar1;
      }
      parser->m_processor = contentProcessor;
      XVar1 = contentProcessor(parser,local_20,end,endPtr);
      return XVar1;
    }
    XVar1 = XML_ERROR_NONE;
  }
  return XVar1;
}

Assistant:

static enum XML_Error PTRCALL
cdataSectionProcessor(XML_Parser parser, const char *start, const char *end,
                      const char **endPtr) {
  enum XML_Error result = doCdataSection(
      parser, parser->m_encoding, &start, end, endPtr,
      (XML_Bool)! parser->m_parsingStatus.finalBuffer, XML_ACCOUNT_DIRECT);
  if (result != XML_ERROR_NONE)
    return result;
  if (start) {
    if (parser->m_parentParser) { /* we are parsing an external entity */
      parser->m_processor = externalEntityContentProcessor;
      return externalEntityContentProcessor(parser, start, end, endPtr);
    } else {
      parser->m_processor = contentProcessor;
      return contentProcessor(parser, start, end, endPtr);
    }
  }
  return result;
}